

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

Value * __thiscall minja::Value::operator-(Value *this)

{
  bool bVar1;
  Value *in_RDI;
  Value *in_stack_00000020;
  Value *this_00;
  
  this_00 = in_RDI;
  bVar1 = is_number_integer((Value *)0x2ecf29);
  if (bVar1) {
    get<long>(in_stack_00000020);
    Value(this_00,(int64_t *)in_RDI);
  }
  else {
    get<double>(in_stack_00000020);
    Value(this_00,(double *)in_RDI);
  }
  return this_00;
}

Assistant:

Value operator-() const {
      if (is_number_integer())
        return -get<int64_t>();
      else
        return -get<double>();
  }